

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE
qpdf_oh_get_stream_data
          (qpdf_data qpdf,qpdf_oh stream_oh,qpdf_stream_decode_level_e decode_level,
          QPDF_BOOL *filtered,uchar **bufp,size_t *len)

{
  QPDF_ERROR_CODE QVar1;
  anon_class_32_5_256ba698 local_70;
  function<void_(_qpdf_data_*)> local_50;
  size_t *local_30;
  size_t *len_local;
  uchar **bufp_local;
  QPDF_BOOL *filtered_local;
  qpdf_stream_decode_level_e decode_level_local;
  qpdf_oh stream_oh_local;
  qpdf_data qpdf_local;
  
  local_70.stream_oh = stream_oh;
  local_70.decode_level = decode_level;
  local_70.filtered = filtered;
  local_70.bufp = bufp;
  local_70.len = len;
  local_30 = len;
  len_local = (size_t *)bufp;
  bufp_local = (uchar **)filtered;
  filtered_local._0_4_ = decode_level;
  filtered_local._4_4_ = stream_oh;
  _decode_level_local = qpdf;
  std::function<void(_qpdf_data*)>::function<qpdf_oh_get_stream_data::__0,void>
            ((function<void(_qpdf_data*)> *)&local_50,&local_70);
  QVar1 = trap_errors(qpdf,&local_50);
  std::function<void_(_qpdf_data_*)>::~function(&local_50);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_oh_get_stream_data(
    qpdf_data qpdf,
    qpdf_oh stream_oh,
    qpdf_stream_decode_level_e decode_level,
    QPDF_BOOL* filtered,
    unsigned char** bufp,
    size_t* len)
{
    return trap_errors(qpdf, [stream_oh, decode_level, filtered, bufp, len](qpdf_data q) {
        auto stream = qpdf_oh_item_internal(q, stream_oh);
        Pipeline* p = nullptr;
        Pl_Buffer buf("stream data");
        if (bufp) {
            p = &buf;
        }
        bool was_filtered = false;
        if (stream.pipeStreamData(p, &was_filtered, 0, decode_level, false, false)) {
            QTC::TC("qpdf", "qpdf-c stream data buf set", bufp ? 0 : 1);
            if (p && bufp && len) {
                buf.getMallocBuffer(bufp, len);
            }
            QTC::TC("qpdf", "qpdf-c stream data filtered set", filtered ? 0 : 1);
            if (filtered) {
                *filtered = was_filtered ? QPDF_TRUE : QPDF_FALSE;
            }
        } else {
            throw std::runtime_error("unable to access stream data for stream " + stream.unparse());
        }
    });
}